

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int i_1;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  int iVar10;
  void *pvVar11;
  long lVar12;
  byte bVar13;
  char cVar14;
  Mat *pMVar15;
  ulong uVar16;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint uVar17;
  long lVar18;
  int q;
  uint uVar19;
  uint uVar20;
  float fVar21;
  undefined4 in_stack_0000000c;
  int local_d0;
  Mat sums;
  Mat local_80;
  ulong local_40;
  float local_34;
  
  lVar12 = CONCAT44(in_stack_0000000c,keepdims);
  sVar1 = a->elemsize;
  iVar10 = a->dims;
  pMVar15 = b;
  local_34 = v0;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar10 == 3) {
      uVar4 = a->w;
      lVar18 = (long)(int)uVar4;
      uVar20 = a->h;
      uVar19 = a->c;
      uVar17 = uVar20 * uVar4;
      bVar3 = !reduce_h;
      pMVar15 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
      cVar14 = (char)pMVar15;
      if ((!reduce_w || bVar3) || cVar14 != '\0') {
        if ((reduce_w && !bVar3) && !reduce_c) {
          pMVar15 = (Mat *)(ulong)uVar19;
          Mat::create(b,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
          uVar5 = 0;
          uVar7 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar7 = uVar5;
          }
          uVar9 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar9 = uVar5;
          }
          for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            pMVar15 = a;
            Mat::channel(&sums,a,(int)uVar5);
            pvVar6 = sums.data;
            Mat::~Mat(&sums);
            fVar21 = 0.0;
            for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
            }
            *(float *)((long)b->data + uVar5 * 4) = fVar21;
          }
          goto LAB_00136e9a;
        }
        if ((reduce_w && !reduce_h) && !reduce_c) {
          pMVar15 = (Mat *)(ulong)uVar20;
          Mat::create(b,uVar20,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
          uVar17 = 0;
          uVar7 = 0;
          if (0 < (int)uVar4) {
            uVar7 = (ulong)uVar4;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
            pMVar15 = a;
            Mat::channel(&sums,a,uVar17);
            pvVar11 = sums.data;
            Mat::~Mat(&sums);
            iVar10 = b->w;
            sVar1 = b->elemsize;
            pvVar6 = b->data;
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              fVar21 = 0.0;
              for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
                fVar21 = fVar21 + ABS(*(float *)((long)pvVar11 + uVar9 * 4));
              }
              *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar17 * (long)iVar10 * sVar1) =
                   fVar21;
              pvVar11 = (void *)((long)pvVar11 + lVar18 * 4);
            }
          }
          goto LAB_00136e9a;
        }
        if ((reduce_w && !reduce_h) && cVar14 == '\0') {
          Mat::create(b,uVar20,sVar1,*(Allocator **)(lVar12 + 8));
          pMVar15 = (Mat *)0x1;
          Mat::Mat(&sums,1,uVar20,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
          local_d0 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar7 = 0;
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            uVar5 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar5 = 0;
            }
            for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
              Mat::channel(&local_80,a,(int)uVar9);
              pvVar6 = local_80.data;
              Mat::~Mat(&local_80);
              pvVar11 = (void *)(sums.cstep * uVar9 * sums.elemsize + (long)sums.data);
              local_80.refcount = (int *)0x0;
              pMVar15 = (Mat *)(ulong)(uint)sums.elempack;
              local_80.elemsize = sums.elemsize;
              local_80.elempack = sums.elempack;
              local_80.allocator = sums.allocator;
              local_80.dims = 2;
              local_80.w = sums.w;
              local_80.h = sums.h;
              local_80.c = 1;
              local_80.cstep = (size_t)(sums.h * sums.w);
              local_80.data = pvVar11;
              Mat::~Mat(&local_80);
              for (uVar16 = 0; uVar16 != uVar20; uVar16 = uVar16 + 1) {
                fVar21 = 0.0;
                for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
                  fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar8 * 4));
                }
                *(float *)((long)pvVar11 + uVar16 * 4) = fVar21;
                pvVar6 = (void *)((long)pvVar6 + lVar18 * 4);
              }
            }
            Mat::fill(b,0.0);
            local_d0 = 0;
            for (uVar7 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar6 = sums.data,
                uVar7 != uVar5; uVar7 = uVar7 + 1) {
              local_80.data = (void *)(sums.cstep * uVar7 * sums.elemsize + (long)sums.data);
              local_80.refcount = (int *)0x0;
              local_80.elemsize = sums.elemsize;
              local_80.elempack = sums.elempack;
              local_80.allocator = sums.allocator;
              local_80.dims = 2;
              local_80.w = sums.w;
              local_80.h = sums.h;
              local_80.c = 1;
              local_80.cstep = (size_t)(sums.h * sums.w);
              pMVar15 = (Mat *)sums.allocator;
              Mat::~Mat(&local_80);
              pvVar11 = b->data;
              for (uVar9 = 0; uVar20 != uVar9; uVar9 = uVar9 + 1) {
                *(float *)((long)pvVar11 + uVar9 * 4) =
                     *(float *)((long)pvVar6 + uVar9 * 4 + sVar2 * sVar1 * uVar7) +
                     *(float *)((long)pvVar11 + uVar9 * 4);
              }
            }
          }
        }
        else {
          if ((bVar3 || reduce_w) || cVar14 != '\0') {
            if ((reduce_w || reduce_h) || cVar14 != '\0') {
              if ((!bVar3 && !reduce_w) && !reduce_c) {
                pMVar15 = (Mat *)(ulong)uVar4;
                Mat::create(b,uVar4,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
                Mat::fill(b,0.0);
                uVar17 = 0;
                uVar7 = 0;
                if (0 < (int)uVar4) {
                  uVar7 = (ulong)uVar4;
                }
                if ((int)uVar20 < 1) {
                  uVar20 = 0;
                }
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                }
                for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
                  pMVar15 = a;
                  Mat::channel(&sums,a,uVar17);
                  pvVar11 = sums.data;
                  Mat::~Mat(&sums);
                  lVar12 = (long)(int)(b->w * uVar17) * b->elemsize;
                  pvVar6 = b->data;
                  for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
                    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
                      *(float *)((long)pvVar6 + uVar5 * 4 + lVar12) =
                           ABS(*(float *)((long)pvVar11 + uVar5 * 4)) +
                           *(float *)((long)pvVar6 + uVar5 * 4 + lVar12);
                    }
                    pvVar11 = (void *)((long)pvVar11 + lVar18 * 4);
                  }
                }
              }
            }
            else {
              pMVar15 = (Mat *)(ulong)uVar4;
              Mat::create(b,uVar4,uVar20,sVar1,*(Allocator **)(lVar12 + 8));
              Mat::fill(b,0.0);
              uVar5 = 0;
              uVar7 = (ulong)uVar17;
              if ((int)uVar17 < 1) {
                uVar7 = uVar5;
              }
              if ((int)uVar19 < 1) {
                uVar19 = 0;
              }
              while (uVar4 = (uint)uVar5, uVar4 != uVar19) {
                pMVar15 = a;
                Mat::channel(&sums,a,uVar4);
                pvVar11 = sums.data;
                Mat::~Mat(&sums);
                pvVar6 = b->data;
                for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
                  *(float *)((long)pvVar6 + uVar5 * 4) =
                       ABS(*(float *)((long)pvVar11 + uVar5 * 4)) +
                       *(float *)((long)pvVar6 + uVar5 * 4);
                }
                uVar5 = (ulong)(uVar4 + 1);
              }
            }
            goto LAB_00136e9a;
          }
          Mat::create(b,uVar4,sVar1,*(Allocator **)(lVar12 + 8));
          pMVar15 = (Mat *)(ulong)uVar4;
          Mat::Mat(&sums,uVar4,1,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
          local_d0 = -100;
          if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
            Mat::fill(&sums,0.0);
            uVar7 = 0;
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar4;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            uVar5 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              uVar5 = 0;
            }
            uVar9 = 0;
            while (uVar9 != uVar5) {
              Mat::channel(&local_80,a,(int)uVar9);
              pvVar11 = local_80.data;
              Mat::~Mat(&local_80);
              sVar2 = sums.cstep;
              sVar1 = sums.elemsize;
              pvVar6 = sums.data;
              local_80.data = (void *)(sums.cstep * uVar9 * sums.elemsize + (long)sums.data);
              local_80.refcount = (int *)0x0;
              local_80.elemsize = sums.elemsize;
              local_80.elempack = sums.elempack;
              local_80.allocator = sums.allocator;
              local_80.dims = 2;
              local_80.w = sums.w;
              local_80.h = sums.h;
              local_80.c = 1;
              local_80.cstep = (size_t)(sums.h * sums.w);
              pMVar15 = (Mat *)sums.allocator;
              local_40 = uVar9;
              Mat::~Mat(&local_80);
              lVar12 = sVar2 * sVar1 * local_40;
              for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
                for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
                  *(float *)((long)pvVar6 + uVar9 * 4 + lVar12) =
                       ABS(*(float *)((long)pvVar11 + uVar9 * 4)) +
                       *(float *)((long)pvVar6 + uVar9 * 4 + lVar12);
                }
                pvVar11 = (void *)((long)pvVar11 + lVar18 * 4);
              }
              uVar9 = local_40 + 1;
            }
            Mat::fill(b,0.0);
            local_d0 = 0;
            for (uVar9 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar6 = sums.data,
                uVar9 != uVar5; uVar9 = uVar9 + 1) {
              local_80.data = (void *)(sums.cstep * uVar9 * sums.elemsize + (long)sums.data);
              local_80.refcount = (int *)0x0;
              local_80.elemsize = sums.elemsize;
              local_80.elempack = sums.elempack;
              local_80.allocator = sums.allocator;
              local_80.dims = 2;
              local_80.w = sums.w;
              local_80.h = sums.h;
              local_80.c = 1;
              local_80.cstep = (size_t)(sums.h * sums.w);
              pMVar15 = (Mat *)sums.allocator;
              Mat::~Mat(&local_80);
              pvVar11 = b->data;
              for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)pvVar11 + uVar16 * 4) =
                     *(float *)((long)pvVar6 + uVar16 * 4 + sVar2 * sVar1 * uVar9) +
                     *(float *)((long)pvVar11 + uVar16 * 4);
              }
            }
          }
        }
        goto LAB_00136fc6;
      }
      Mat::create(b,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)(ulong)uVar19;
      Mat::Mat(&sums,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
      local_d0 = -100;
      if (sums.data == (void *)0x0) goto LAB_0013603b;
      if ((long)sums.c * sums.cstep != 0) {
        uVar5 = 0;
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = uVar5;
        }
        uVar9 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar9 = uVar5;
        }
        for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
          pMVar15 = a;
          Mat::channel(&local_80,a,(int)uVar5);
          pvVar6 = local_80.data;
          Mat::~Mat(&local_80);
          fVar21 = 0.0;
          for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
          }
          *(float *)((long)sums.data + uVar5 * 4) = fVar21;
        }
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + *(float *)((long)sums.data + uVar7 * 4);
        }
        goto LAB_0013638b;
      }
    }
    else {
      if (iVar10 != 2) {
        if (iVar10 != 1) goto LAB_00136e9a;
        uVar4 = a->w;
        pMVar15 = (Mat *)0x1;
        Mat::create(b,1,sVar1,*(Allocator **)(lVar12 + 8));
        uVar5 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = uVar5;
        }
        fVar21 = 0.0;
        for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)a->data + uVar5 * 4));
        }
        goto LAB_00135956;
      }
      uVar4 = a->w;
      uVar20 = a->h;
      uVar7 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
      bVar13 = (byte)uVar7 ^ 1;
      if (bVar13 != 0 || !reduce_h) {
        bVar13 = bVar13 | reduce_h;
        pMVar15 = (Mat *)CONCAT71((int7)(uVar7 >> 8),bVar13);
        if (bVar13 == 0) {
          Mat::create(b,uVar20,sVar1,*(Allocator **)(lVar12 + 8));
          pvVar6 = a->data;
          uVar5 = 0;
          uVar7 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar7 = uVar5;
          }
          iVar10 = a->w;
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = uVar5;
          }
          pMVar15 = (Mat *)b->data;
          sVar1 = a->elemsize;
          for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            fVar21 = 0.0;
            for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
            }
            *(float *)((long)&pMVar15->data + uVar5 * 4) = fVar21;
            pvVar6 = (void *)((long)pvVar6 + (long)iVar10 * sVar1);
          }
        }
        else if (reduce_h && !reduce_w) {
          Mat::create(b,uVar4,sVar1,*(Allocator **)(lVar12 + 8));
          Mat::fill(b,0.0);
          uVar5 = 0;
          uVar7 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar7 = uVar5;
          }
          pvVar6 = a->data;
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = uVar5;
          }
          iVar10 = a->w;
          sVar1 = a->elemsize;
          pMVar15 = a;
          for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            pMVar15 = (Mat *)b->data;
            for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)&pMVar15->data + uVar16 * 4) =
                   ABS(*(float *)((long)pvVar6 + uVar16 * 4)) +
                   *(float *)((long)&pMVar15->data + uVar16 * 4);
            }
            pvVar6 = (void *)((long)pvVar6 + (long)iVar10 * sVar1);
          }
        }
        goto LAB_00136e9a;
      }
      Mat::create(b,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)(ulong)uVar20;
      Mat::Mat(&sums,uVar20,sVar1,*(Allocator **)(lVar12 + 0x10));
      local_d0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar5 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = uVar5;
        }
        pvVar6 = a->data;
        uVar9 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar9 = uVar5;
        }
        pMVar15 = (Mat *)((long)a->w * a->elemsize);
        for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
          fVar21 = 0.0;
          for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
          }
          *(float *)((long)sums.data + uVar5 * 4) = fVar21;
          pvVar6 = (void *)((long)&pMVar15->data + (long)pvVar6);
        }
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + *(float *)((long)sums.data + uVar7 * 4);
        }
        goto LAB_0013638b;
      }
    }
LAB_0013639a:
    Mat::~Mat(&sums);
  }
  else {
    if (iVar10 != 3) {
      if (iVar10 != 2) {
        if (iVar10 != 1) goto LAB_00136e9a;
        uVar4 = a->w;
        pMVar15 = (Mat *)0x1;
        Mat::create(b,1,sVar1,*(Allocator **)(lVar12 + 8));
        uVar5 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = uVar5;
        }
        fVar21 = 0.0;
        for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)a->data + uVar5 * 4));
        }
LAB_00135956:
        *(float *)b->data = fVar21;
        goto LAB_00136e9a;
      }
      uVar4 = a->w;
      uVar20 = a->h;
      uVar7 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
      bVar13 = (byte)uVar7 ^ 1;
      if (bVar13 != 0 || !reduce_h) {
        bVar13 = bVar13 | reduce_h;
        if (bVar13 == 0) {
          Mat::create(b,1,uVar20,sVar1,*(Allocator **)(lVar12 + 8));
          pvVar6 = a->data;
          uVar5 = 0;
          uVar7 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar7 = uVar5;
          }
          iVar10 = a->w;
          uVar9 = (ulong)uVar20;
          if ((int)uVar20 < 1) {
            uVar9 = uVar5;
          }
          pMVar15 = (Mat *)b->data;
          sVar1 = a->elemsize;
          for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
            fVar21 = 0.0;
            for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
            }
            *(float *)((long)&pMVar15->data + uVar5 * 4) = fVar21;
            pvVar6 = (void *)((long)pvVar6 + (long)iVar10 * sVar1);
          }
        }
        else {
          pMVar15 = (Mat *)CONCAT71((int7)(uVar7 >> 8),bVar13);
          if (reduce_h && !reduce_w) {
            Mat::create(b,uVar4,1,sVar1,*(Allocator **)(lVar12 + 8));
            Mat::fill(b,0.0);
            uVar5 = 0;
            uVar7 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar7 = uVar5;
            }
            pvVar6 = a->data;
            uVar9 = (ulong)uVar20;
            if ((int)uVar20 < 1) {
              uVar9 = uVar5;
            }
            iVar10 = a->w;
            sVar1 = a->elemsize;
            for (; pMVar15 = a, uVar5 != uVar9; uVar5 = uVar5 + 1) {
              a = (Mat *)b->data;
              for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
                *(float *)((long)&a->data + uVar16 * 4) =
                     ABS(*(float *)((long)pvVar6 + uVar16 * 4)) +
                     *(float *)((long)&a->data + uVar16 * 4);
              }
              pvVar6 = (void *)((long)pvVar6 + (long)iVar10 * sVar1);
            }
          }
        }
        goto LAB_00136e9a;
      }
      local_d0 = -100;
      Mat::create(b,1,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)(ulong)uVar20;
      Mat::Mat(&sums,uVar20,sVar1,*(Allocator **)(lVar12 + 0x10));
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar5 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = uVar5;
        }
        pvVar6 = a->data;
        uVar9 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar9 = uVar5;
        }
        pMVar15 = (Mat *)((long)a->w * a->elemsize);
        for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
          fVar21 = 0.0;
          for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
          }
          *(float *)((long)sums.data + uVar5 * 4) = fVar21;
          pvVar6 = (void *)((long)&pMVar15->data + (long)pvVar6);
        }
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + *(float *)((long)sums.data + uVar7 * 4);
        }
LAB_0013638b:
        *(float *)b->data = fVar21;
        local_d0 = 0;
      }
      goto LAB_0013639a;
    }
    uVar4 = a->w;
    lVar18 = (long)(int)uVar4;
    uVar20 = a->h;
    uVar19 = a->c;
    uVar17 = uVar20 * uVar4;
    bVar3 = !reduce_h;
    pMVar15 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
    cVar14 = (char)pMVar15;
    if ((reduce_w && !bVar3) && cVar14 == '\0') {
      Mat::create(b,1,1,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)(ulong)uVar19;
      Mat::Mat(&sums,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
      local_d0 = -100;
      if (sums.data == (void *)0x0) {
LAB_0013603b:
        local_d0 = -100;
      }
      else if ((long)sums.c * sums.cstep != 0) {
        uVar5 = 0;
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = uVar5;
        }
        uVar9 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          uVar9 = uVar5;
        }
        for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
          pMVar15 = a;
          Mat::channel(&local_80,a,(int)uVar5);
          pvVar6 = local_80.data;
          Mat::~Mat(&local_80);
          fVar21 = 0.0;
          for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
          }
          *(float *)((long)sums.data + uVar5 * 4) = fVar21;
        }
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + *(float *)((long)sums.data + uVar7 * 4);
        }
        goto LAB_0013638b;
      }
      goto LAB_0013639a;
    }
    if ((reduce_w && !bVar3) && !reduce_c) {
      pMVar15 = (Mat *)0x1;
      Mat::create(b,1,1,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
      uVar5 = 0;
      uVar7 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar7 = uVar5;
      }
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      while (uVar4 = (uint)uVar5, uVar4 != uVar19) {
        Mat::channel(&sums,a,uVar4);
        pvVar6 = sums.data;
        Mat::~Mat(&sums);
        pMVar15 = b;
        Mat::channel(&sums,b,uVar4);
        pvVar11 = sums.data;
        Mat::~Mat(&sums);
        fVar21 = 0.0;
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar5 * 4));
        }
        *(float *)pvVar11 = fVar21;
        uVar5 = (ulong)(uVar4 + 1);
      }
      goto LAB_00136e9a;
    }
    if ((reduce_w && !reduce_h) && !reduce_c) {
      pMVar15 = (Mat *)0x1;
      Mat::create(b,1,uVar20,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
      uVar7 = 0;
      uVar5 = 0;
      if (0 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = uVar7;
      }
      local_40 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        local_40 = uVar7;
      }
      while( true ) {
        iVar10 = (int)uVar7;
        if (iVar10 == (int)local_40) break;
        Mat::channel(&sums,a,iVar10);
        pvVar6 = sums.data;
        Mat::~Mat(&sums);
        pMVar15 = b;
        Mat::channel(&sums,b,iVar10);
        pvVar11 = sums.data;
        Mat::~Mat(&sums);
        for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
          fVar21 = 0.0;
          for (uVar16 = 0; uVar5 != uVar16; uVar16 = uVar16 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
          }
          *(float *)((long)pvVar11 + uVar7 * 4) = fVar21;
          pvVar6 = (void *)((long)pvVar6 + lVar18 * 4);
        }
        uVar7 = (ulong)(iVar10 + 1);
      }
      goto LAB_00136e9a;
    }
    if ((reduce_w && !reduce_h) && cVar14 == '\0') {
      Mat::create(b,1,uVar20,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)0x1;
      Mat::Mat(&sums,1,uVar20,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
      local_d0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        Mat::fill(&sums,0.0);
        uVar7 = 0;
        if (0 < (int)uVar4) {
          uVar7 = (ulong)uVar4;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        local_40 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          local_40 = 0;
        }
        for (uVar5 = 0; uVar5 != local_40; uVar5 = uVar5 + 1) {
          Mat::channel(&local_80,a,(int)uVar5);
          pvVar6 = local_80.data;
          Mat::~Mat(&local_80);
          pvVar11 = (void *)(sums.cstep * uVar5 * sums.elemsize + (long)sums.data);
          local_80.refcount = (int *)0x0;
          pMVar15 = (Mat *)(ulong)(uint)sums.elempack;
          local_80.elemsize = sums.elemsize;
          local_80.elempack = sums.elempack;
          local_80.allocator = sums.allocator;
          local_80.dims = 2;
          local_80.w = sums.w;
          local_80.h = sums.h;
          local_80.c = 1;
          local_80.cstep = (size_t)(sums.h * sums.w);
          local_80.data = pvVar11;
          Mat::~Mat(&local_80);
          for (uVar9 = 0; uVar9 != uVar20; uVar9 = uVar9 + 1) {
            fVar21 = 0.0;
            for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = fVar21 + ABS(*(float *)((long)pvVar6 + uVar16 * 4));
            }
            *(float *)((long)pvVar11 + uVar9 * 4) = fVar21;
            pvVar6 = (void *)((long)pvVar6 + lVar18 * 4);
          }
        }
        Mat::fill(b,0.0);
        local_d0 = 0;
        for (uVar7 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar6 = sums.data,
            uVar7 != local_40; uVar7 = uVar7 + 1) {
          local_80.data = (void *)(sums.cstep * uVar7 * sums.elemsize + (long)sums.data);
          local_80.refcount = (int *)0x0;
          local_80.elemsize = sums.elemsize;
          local_80.elempack = sums.elempack;
          local_80.allocator = sums.allocator;
          local_80.dims = 2;
          local_80.w = sums.w;
          local_80.h = sums.h;
          local_80.c = 1;
          local_80.cstep = (size_t)(sums.h * sums.w);
          pMVar15 = (Mat *)sums.allocator;
          Mat::~Mat(&local_80);
          pvVar11 = b->data;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar11 + uVar5 * 4) =
                 *(float *)((long)pvVar6 + uVar5 * 4 + sVar2 * sVar1 * uVar7) +
                 *(float *)((long)pvVar11 + uVar5 * 4);
          }
        }
      }
    }
    else {
      if ((bVar3 || reduce_w) || cVar14 != '\0') {
        if ((reduce_w || reduce_h) || cVar14 != '\0') {
          if ((!bVar3 && !reduce_w) && !reduce_c) {
            pMVar15 = (Mat *)(ulong)uVar4;
            Mat::create(b,uVar4,1,uVar19,sVar1,*(Allocator **)(lVar12 + 8));
            Mat::fill(b,0.0);
            uVar7 = 0;
            uVar5 = 0;
            if (0 < (int)uVar4) {
              uVar5 = (ulong)uVar4;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            local_40 = (ulong)uVar19;
            if ((int)uVar19 < 1) {
              local_40 = uVar7;
            }
            while( true ) {
              iVar10 = (int)uVar7;
              if (iVar10 == (int)local_40) break;
              Mat::channel(&sums,a,iVar10);
              pvVar6 = sums.data;
              Mat::~Mat(&sums);
              pMVar15 = b;
              Mat::channel(&sums,b,iVar10);
              pvVar11 = sums.data;
              Mat::~Mat(&sums);
              for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
                for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
                  *(float *)((long)pvVar11 + uVar7 * 4) =
                       ABS(*(float *)((long)pvVar6 + uVar7 * 4)) +
                       *(float *)((long)pvVar11 + uVar7 * 4);
                }
                pvVar6 = (void *)((long)pvVar6 + lVar18 * 4);
              }
              uVar7 = (ulong)(iVar10 + 1);
            }
          }
        }
        else {
          pMVar15 = (Mat *)(ulong)uVar4;
          Mat::create(b,uVar4,uVar20,1,sVar1,*(Allocator **)(lVar12 + 8));
          Mat::fill(b,0.0);
          uVar5 = 0;
          uVar7 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar7 = uVar5;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          while (uVar4 = (uint)uVar5, uVar4 != uVar19) {
            pMVar15 = a;
            Mat::channel(&sums,a,uVar4);
            pvVar11 = sums.data;
            Mat::~Mat(&sums);
            pvVar6 = b->data;
            for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
              *(float *)((long)pvVar6 + uVar5 * 4) =
                   ABS(*(float *)((long)pvVar11 + uVar5 * 4)) + *(float *)((long)pvVar6 + uVar5 * 4)
              ;
            }
            uVar5 = (ulong)(uVar4 + 1);
          }
        }
        goto LAB_00136e9a;
      }
      Mat::create(b,uVar4,1,1,sVar1,*(Allocator **)(lVar12 + 8));
      pMVar15 = (Mat *)(ulong)uVar4;
      Mat::Mat(&sums,uVar4,1,uVar19,sVar1,*(Allocator **)(lVar12 + 0x10));
      local_d0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        Mat::fill(&sums,0.0);
        uVar7 = 0;
        if (0 < (int)uVar4) {
          uVar7 = (ulong)uVar4;
        }
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        local_40 = (ulong)uVar19;
        if ((int)uVar19 < 1) {
          local_40 = 0;
        }
        for (uVar5 = 0; uVar5 != local_40; uVar5 = uVar5 + 1) {
          Mat::channel(&local_80,a,(int)uVar5);
          pvVar11 = local_80.data;
          Mat::~Mat(&local_80);
          sVar2 = sums.cstep;
          sVar1 = sums.elemsize;
          pvVar6 = sums.data;
          local_80.data = (void *)(sums.cstep * uVar5 * sums.elemsize + (long)sums.data);
          local_80.refcount = (int *)0x0;
          local_80.elemsize = sums.elemsize;
          local_80.elempack = sums.elempack;
          local_80.allocator = sums.allocator;
          local_80.dims = 2;
          local_80.w = sums.w;
          local_80.h = sums.h;
          local_80.c = 1;
          local_80.cstep = (size_t)(sums.h * sums.w);
          pMVar15 = (Mat *)sums.allocator;
          Mat::~Mat(&local_80);
          lVar12 = sVar2 * sVar1 * uVar5;
          for (uVar4 = 0; uVar4 != uVar20; uVar4 = uVar4 + 1) {
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar6 + uVar9 * 4 + lVar12) =
                   ABS(*(float *)((long)pvVar11 + uVar9 * 4)) +
                   *(float *)((long)pvVar6 + uVar9 * 4 + lVar12);
            }
            pvVar11 = (void *)((long)pvVar11 + lVar18 * 4);
          }
        }
        Mat::fill(b,0.0);
        local_d0 = 0;
        for (uVar5 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar6 = sums.data,
            uVar5 != local_40; uVar5 = uVar5 + 1) {
          local_80.data = (void *)(sums.cstep * uVar5 * sums.elemsize + (long)sums.data);
          local_80.refcount = (int *)0x0;
          local_80.elemsize = sums.elemsize;
          local_80.elempack = sums.elempack;
          local_80.allocator = sums.allocator;
          local_80.dims = 2;
          local_80.w = sums.w;
          local_80.h = sums.h;
          local_80.c = 1;
          local_80.cstep = (size_t)(sums.h * sums.w);
          pMVar15 = (Mat *)sums.allocator;
          Mat::~Mat(&local_80);
          pvVar11 = b->data;
          for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
            *(float *)((long)pvVar11 + uVar9 * 4) =
                 *(float *)((long)pvVar6 + uVar9 * 4 + sVar2 * sVar1 * uVar5) +
                 *(float *)((long)pvVar11 + uVar9 * 4);
          }
        }
      }
    }
LAB_00136fc6:
    Mat::~Mat(&sums);
  }
  if (local_d0 != 0) {
    return -100;
  }
LAB_00136e9a:
  if (1.1920929e-07 < ABS(local_34 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,local_34,(Option *)pMVar15);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}